

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::readFromBinary(Binasc *this,ostream *out,string *infile)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  ifstream input;
  istream aiStack_228 [520];
  
  std::ifstream::ifstream(aiStack_228);
  std::ifstream::open((char *)aiStack_228,(_Ios_Openmode)(infile->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot open ",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(infile->_M_dataplus)._M_p,infile->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," for reading in binasc.",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    iVar2 = 0;
    std::ostream::flush();
  }
  else {
    iVar2 = readFromBinary(this,out,aiStack_228);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(aiStack_228);
  return iVar2;
}

Assistant:

int Binasc::readFromBinary(std::ostream& out, const std::string& infile) {
	std::ifstream input;
	input.open(infile.c_str());
	if (!input.is_open()) {
		std::cerr << "Cannot open " << infile
		          << " for reading in binasc." << std::endl;
		return 0;
	}

	int status = readFromBinary(out, input);
	input.close();
	return status;
}